

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall ast::BinaryOp::BinaryOp(BinaryOp *this,Token *t,int p,int a,int line)

{
  TokenType TVar1;
  pointer pcVar2;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  TVar1 = t->Type;
  pcVar2 = (t->Literal)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (t->Literal)._M_string_length);
  (this->super_Op).super_Expr.super_Node.lineno = line;
  (this->super_Op).super_Expr.super_Node.type_value = BinaryOpType;
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR__Op_00179990;
  (this->super_Op).tok._vptr_Token = (_func_int **)&PTR__Token_001788e0;
  (this->super_Op).tok.Type = TVar1;
  (this->super_Op).tok.Literal._M_dataplus._M_p = (pointer)&(this->super_Op).tok.Literal.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Op).tok.Literal,local_50,local_48 + (long)local_50);
  (this->super_Op).precedence = p;
  (this->super_Op).associative = a;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR__BinaryOp_00179960;
  this->RightOp = (Expr *)0x0;
  this->LeftOp = (Expr *)0x0;
  return;
}

Assistant:

BinaryOp(Token t, int p, int a, int line)
        :Op(t, p, a, line, NodeType::BinaryOpType), RightOp{nullptr}, LeftOp{nullptr} {}